

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

Qiniu_Error
Qiniu_callex(CURL *curl,Qiniu_Buffer *resp,Qiniu_Json **ret,Qiniu_Bool simpleError,
            Qiniu_Buffer *resph)

{
  uint uVar1;
  ulong in_RAX;
  size_t sVar2;
  cJSON *pcVar3;
  char *pcVar4;
  Qiniu_Error QVar5;
  long httpCode;
  ulong local_38;
  
  local_38 = in_RAX;
  curl_easy_setopt(curl,0x4e2b,Qiniu_Buffer_Fwrite);
  curl_easy_setopt(curl,0x2711,resp);
  if (resph != (Qiniu_Buffer *)0x0) {
    curl_easy_setopt(curl,0x4e6f,Qiniu_Buffer_Fwrite);
    curl_easy_setopt(curl,0x272d,resph);
  }
  uVar1 = curl_easy_perform(curl);
  if (uVar1 == 0) {
    pcVar3 = (cJSON *)0x0;
    curl_easy_getinfo(curl,0x200002,&local_38);
    sVar2 = Qiniu_Buffer_Len(resp);
    if (sVar2 != 0) {
      pcVar4 = Qiniu_Buffer_CStr(resp);
      pcVar3 = cJSON_Parse(pcVar4);
    }
    *ret = pcVar3;
    if (local_38 - 200 < 100) {
      pcVar4 = "OK";
    }
    else {
      pcVar4 = "http status code is not OK";
      if (pcVar3 != (cJSON *)0x0 && simpleError == 0) {
        pcVar3 = cJSON_GetObjectItem(pcVar3,"error");
        if ((pcVar3 != (cJSON *)0x0) && (pcVar3->type == 4)) {
          pcVar4 = pcVar3->valuestring;
        }
      }
    }
  }
  else {
    local_38 = (ulong)uVar1;
    *ret = (Qiniu_Json *)0x0;
    pcVar4 = "curl_easy_perform error";
  }
  QVar5._0_8_ = local_38 & 0xffffffff;
  QVar5.message = pcVar4;
  return QVar5;
}

Assistant:

Qiniu_Error Qiniu_callex(CURL *curl, Qiniu_Buffer *resp, Qiniu_Json **ret, Qiniu_Bool simpleError,
                         Qiniu_Buffer *resph)
{
    Qiniu_Error err;
    CURLcode curlCode;
    long httpCode;
    Qiniu_Json *root;

    curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, Qiniu_Buffer_Fwrite);
    curl_easy_setopt(curl, CURLOPT_WRITEDATA, resp);
    if (resph != NULL)
    {
        curl_easy_setopt(curl, CURLOPT_HEADERFUNCTION, Qiniu_Buffer_Fwrite);
        curl_easy_setopt(curl, CURLOPT_WRITEHEADER, resph);
    }

    curlCode = curl_easy_perform(curl);

    if (curlCode == 0)
    {
        curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &httpCode);
        if (Qiniu_Buffer_Len(resp) != 0)
        {
            root = cJSON_Parse(Qiniu_Buffer_CStr(resp));
        }
        else
        {
            root = NULL;
        }
        *ret = root;
        err.code = (int)httpCode;
        if (httpCode / 100 != 2)
        {
            if (simpleError)
            {
                err.message = g_statusCodeError;
            }
            else
            {
                err.message = Qiniu_Json_GetString(root, "error", g_statusCodeError);
            }
        }
        else
        {
            err.message = "OK";
        }
    }
    else
    {
        *ret = NULL;
        err.code = curlCode;
        err.message = "curl_easy_perform error";
    }

    return err;
}